

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filters.cpp
# Opt level: O3

set<mPoint,_std::less<mPoint>,_std::allocator<mPoint>_> *
findCluster(set<mPoint,_std::less<mPoint>,_std::allocator<mPoint>_> *__return_storage_ptr__,
           Mat *binary,int x,int y)

{
  _Rb_tree_header *p_Var1;
  mPoint local_80;
  Mat local_78 [96];
  
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  cv::Mat::Mat(local_78,binary);
  local_80.super_Point.x = x;
  local_80.super_Point.y = y;
  searchCluster(local_78,&local_80,__return_storage_ptr__);
  cv::Mat::~Mat(local_78);
  return __return_storage_ptr__;
}

Assistant:

std::set<mPoint> findCluster(cv::Mat binary, int x, int y) {
	std::set<mPoint> cluster;
	searchCluster(binary, mPoint(x, y), cluster);
	return cluster;
}